

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_internal_validate(art_t *art,char **reason,art_validate_cb_t validate_cb)

{
  art_internal_validate_t validator_00;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  art_internal_validate_t validator;
  char *reason_local;
  undefined1 *local_50;
  uint in_stack_ffffffffffffffcc;
  undefined1 auStack_2e [6];
  undefined8 local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var1;
  
  if (in_RSI == (undefined8 *)0x0) {
    in_RSI = &local_28;
  }
  *in_RSI = 0;
  if (*in_RDI == 0) {
    _Var1 = true;
  }
  else {
    local_50 = &stack0xffffffffffffffcd;
    do {
      *local_50 = 0;
      local_50 = local_50 + 1;
    } while (local_50 != auStack_2e);
    validator_00.validate_cb = (art_validate_cb_t)in_RSI;
    validator_00.reason = (char **)in_RDX;
    validator_00._16_8_ = in_RDI;
    validator_00.current_key[4] = (char)in_stack_fffffffffffffff8;
    validator_00.current_key[5] = (char)((uint7)in_stack_fffffffffffffff8 >> 8);
    validator_00._26_5_ = (int5)((uint7)in_stack_fffffffffffffff8 >> 0x10);
    validator_00._31_1_ = in_stack_ffffffffffffffff;
    _Var1 = art_internal_validate_at
                      ((art_node_t *)((ulong)(in_stack_ffffffffffffffcc & 0xffffff00) << 0x20),
                       validator_00);
  }
  return _Var1;
}

Assistant:

bool art_internal_validate(const art_t *art, const char **reason,
                           art_validate_cb_t validate_cb) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    if (art->root == NULL) {
        return true;
    }
    art_internal_validate_t validator = {
        .reason = reason,
        .validate_cb = validate_cb,
        .depth = 0,
        .current_key = {0},
    };
    return art_internal_validate_at(art->root, validator);
}